

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  cJSON_bool cVar1;
  size_t sVar2;
  cJSON *item;
  parse_buffer *input_buffer;
  size_t sVar3;
  parse_buffer local_60;
  
  local_60.depth = 0;
  global_error_0 = (char *)0x0;
  global_error_1 = 0;
  if (value != (char *)0x0) {
    local_60.content = (uchar *)value;
    sVar2 = strlen(value);
    sVar3 = sVar2 + 1;
    local_60.offset = 0;
    local_60.hooks.allocate._0_4_ = global_hooks.allocate._0_4_;
    local_60.hooks.allocate._4_4_ = global_hooks.allocate._4_4_;
    local_60.hooks.deallocate._0_4_ = global_hooks.deallocate._0_4_;
    local_60.hooks.deallocate._4_4_ = global_hooks.deallocate._4_4_;
    local_60.hooks.reallocate = global_hooks.reallocate;
    local_60.length = sVar3;
    item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))
                              (0x40);
    if (item == (cJSON *)0x0) {
      local_60.offset = 0;
    }
    else {
      item->valuedouble = 0.0;
      item->string = (char *)0x0;
      item->valuestring = (char *)0x0;
      *(undefined8 *)&item->valueint = 0;
      item->child = (cJSON *)0x0;
      *(undefined8 *)&item->type = 0;
      item->next = (cJSON *)0x0;
      item->prev = (cJSON *)0x0;
      input_buffer = buffer_skip_whitespace(&local_60);
      cVar1 = parse_value(item,input_buffer);
      if ((cVar1 != 0) &&
         ((require_null_terminated == 0 ||
          ((buffer_skip_whitespace(&local_60), local_60.offset < local_60.length &&
           (local_60.content[local_60.offset] == '\0')))))) {
        if (return_parse_end == (char **)0x0) {
          return item;
        }
        *return_parse_end = (char *)(local_60.content + local_60.offset);
        return item;
      }
      cJSON_Delete(item);
      sVar3 = local_60.length;
    }
    global_error_1 = 0;
    if (sVar3 != 0) {
      global_error_1 = sVar3 - 1;
    }
    if (local_60.offset < sVar3) {
      global_error_1 = local_60.offset;
    }
    global_error_0 = value;
    if (return_parse_end != (char **)0x0) {
      *return_parse_end = value + global_error_1;
    }
  }
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = strlen((const char*)value) + sizeof("");
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(&buffer)))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }
 
        global_error = local_error;
    }

    return NULL;
}